

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentLocals.cpp
# Opt level: O1

void __thiscall wasm::InstrumentLocals::visitLocalGet(InstrumentLocals *this,LocalGet *curr)

{
  Type *this_00;
  Index x;
  ulong uVar1;
  Name target;
  HeapType HVar2;
  size_t *psVar3;
  Call *expression;
  char *__assertion;
  initializer_list<wasm::Expression_*> __l;
  Const *local_80;
  Const *local_78;
  LocalGet *local_70;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_68;
  Builder local_50;
  Builder builder;
  size_t local_40;
  char *local_38;
  
  local_50.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>_>
       ).super_PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>.
       super_Walker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>.currModule
  ;
  uVar1 = (curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id;
  if ((uVar1 & 1) == 0 && 6 < uVar1) {
    this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type;
    HVar2 = wasm::Type::getHeapType(this_00);
    if (HVar2.id == 8) {
      if ((this_00->id < 7) || (((uint)this_00->id & 3) != 2)) goto LAB_00904f2b;
      psVar3 = &get_externref;
    }
    else {
      if ((HVar2.id != 0x10) || (((uint)this_00->id & 3) != 2 || this_00->id < 7)) {
LAB_00904f2b:
        handle_unreachable("TODO: general reference types",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/InstrumentLocals.cpp"
                           ,0x54);
      }
      psVar3 = &get_funcref;
    }
    goto LAB_00904e48;
  }
  if ((uVar1 & 1) != 0 && 6 < uVar1) {
    __assertion = "!curr->type.isTuple() && \"Unexpected tuple type\"";
LAB_00904f53:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/InstrumentLocals.cpp"
                  ,0x57,"void wasm::InstrumentLocals::visitLocalGet(LocalGet *)");
  }
  if (6 < uVar1) {
    __assertion = "curr->type.isBasic() && \"TODO: handle compound types\"";
    goto LAB_00904f53;
  }
  switch(uVar1 & 0xffffffff) {
  case 0:
  case 1:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/InstrumentLocals.cpp"
                       ,0x69);
  case 2:
    psVar3 = &get_i32;
    break;
  case 3:
    goto switchD_00904e13_caseD_3;
  case 4:
    psVar3 = &get_f32;
    break;
  case 5:
    psVar3 = &get_f64;
    break;
  case 6:
    psVar3 = &get_v128;
    break;
  default:
    local_38 = (char *)0x0;
    local_40 = 0;
    goto LAB_00904e57;
  }
LAB_00904e48:
  local_40 = *psVar3;
  local_38 = (char *)psVar3[1];
LAB_00904e57:
  x = this->id;
  this->id = x + 1;
  local_80 = Builder::makeConst<int>(&local_50,x);
  local_78 = Builder::makeConst<int>(&local_50,curr->index);
  __l._M_len = 3;
  __l._M_array = (iterator)&local_80;
  local_70 = curr;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_68,__l,(allocator_type *)((long)&builder.wasm + 7));
  target.super_IString.str._M_str = local_38;
  target.super_IString.str._M_len = local_40;
  expression = Builder::makeCall(&local_50,target,&local_68,
                                 (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)8>).
                                       super_Expression.type.id,false);
  Walker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>_>
              ).
              super_PostWalker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>
              .super_Walker<wasm::InstrumentLocals,_wasm::Visitor<wasm::InstrumentLocals,_void>_>,
             (Expression *)expression);
  if (local_68.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
switchD_00904e13_caseD_3:
  return;
}

Assistant:

void visitLocalGet(LocalGet* curr) {
    Builder builder(*getModule());
    Name import;
    if (curr->type.isRef()) {
      auto heapType = curr->type.getHeapType();
      if (heapType == HeapType::func && curr->type.isNullable()) {
        import = get_funcref;
      } else if (heapType == HeapType::ext && curr->type.isNullable()) {
        import = get_externref;
      } else {
        WASM_UNREACHABLE("TODO: general reference types");
      }
    } else {
      TODO_SINGLE_COMPOUND(curr->type);
      switch (curr->type.getBasic()) {
        case Type::i32:
          import = get_i32;
          break;
        case Type::i64:
          return; // TODO
        case Type::f32:
          import = get_f32;
          break;
        case Type::f64:
          import = get_f64;
          break;
        case Type::v128:
          import = get_v128;
          break;
        case Type::none:
        case Type::unreachable:
          WASM_UNREACHABLE("unexpected type");
      }
    }
    replaceCurrent(builder.makeCall(import,
                                    {builder.makeConst(int32_t(id++)),
                                     builder.makeConst(int32_t(curr->index)),
                                     curr},
                                    curr->type));
  }